

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void FBehavior::StaticMarkLevelVarStrings(void)

{
  DLevelScript *this;
  DACSThinker *pDVar1;
  DWORD modnum;
  ulong uVar2;
  DLevelScript **ppDVar3;
  
  for (uVar2 = 0; uVar2 < StaticModules.Count; uVar2 = uVar2 + 1) {
    MarkMapVarStrings(StaticModules.Array[uVar2]);
  }
  pDVar1 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
  if (pDVar1 != (DACSThinker *)0x0) {
    pDVar1 = GC::ReadBarrier<DACSThinker>((DACSThinker **)&DACSThinker::ActiveThinker);
    ppDVar3 = &pDVar1->Scripts;
    while (this = *ppDVar3, this != (DLevelScript *)0x0) {
      DLevelScript::MarkLocalVarStrings(this);
      ppDVar3 = &this->next;
    }
  }
  return;
}

Assistant:

void FBehavior::StaticMarkLevelVarStrings()
{
	// Mark map variables.
	for (DWORD modnum = 0; modnum < StaticModules.Size(); ++modnum)
	{
		StaticModules[modnum]->MarkMapVarStrings();
	}
	// Mark running scripts' local variables.
	if (DACSThinker::ActiveThinker != NULL)
	{
		for (DLevelScript *script = DACSThinker::ActiveThinker->Scripts; script != NULL; script = script->GetNext())
		{
			script->MarkLocalVarStrings();
		}
	}
}